

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

void __thiscall FIX::Message::Message(Message *this,BeginString *beginString,MsgType *msgType)

{
  Header *this_00;
  long *plVar1;
  void *pvVar2;
  atomic<long> *counter;
  message_order local_48;
  
  local_48.m_mode = normal;
  local_48.m_delim = 0;
  local_48.m_groupOrder.m_size._0_4_ = 0;
  local_48.m_groupOrder.m_size._4_4_ = 0;
  local_48.m_groupOrder.m_buffer._0_4_ = 0;
  local_48.m_groupOrder.m_buffer._4_4_ = 0;
  local_48.m_largest = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&local_48);
  plVar1 = (long *)CONCAT44(local_48.m_groupOrder.m_buffer._4_4_,
                            local_48.m_groupOrder.m_buffer._0_4_);
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      pvVar2 = (void *)CONCAT44(local_48.m_groupOrder.m_buffer._4_4_,
                                local_48.m_groupOrder.m_buffer._0_4_);
      local_48.m_groupOrder.m_size._0_4_ = 0;
      local_48.m_groupOrder.m_size._4_4_ = 0;
      local_48.m_groupOrder.m_buffer._0_4_ = 0;
      local_48.m_groupOrder.m_buffer._4_4_ = 0;
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
      }
    }
  }
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001f6428;
  this_00 = &this->m_header;
  Header::Header(this_00);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  FieldMap::setField(&this_00->super_FieldMap,(FieldBase *)beginString,true);
  FieldMap::setField(&this_00->super_FieldMap,(FieldBase *)msgType,true);
  return;
}

Assistant:

Message::Message(const BeginString &beginString, const MsgType &msgType)
    : m_validStructure(true),
      m_tag(0) {
  m_header.setField(beginString);
  m_header.setField(msgType);
}